

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O0

void __thiscall
bsim::dynamic_bit_vector::dynamic_bit_vector(dynamic_bit_vector *this,int N_,string *str_raw)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong in_RDX;
  int in_ESI;
  dynamic_bit_vector *in_RDI;
  int i_2;
  int ind;
  uchar val;
  int i_1;
  int len;
  int i;
  string str;
  int num_digits;
  uchar in_stack_ffffffffffffff8b;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_44;
  string local_40 [36];
  int local_1c;
  ulong local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x21c39a);
  in_RDI->N = local_c;
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  local_44 = 0;
  do {
    iVar2 = local_44;
    iVar1 = std::__cxx11::string::size();
    if (iVar1 <= iVar2) {
      if (local_1c <= in_RDI->N) {
        iVar3 = std::__cxx11::string::size();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        iVar1 = iVar3;
        while (iVar1 = iVar1 + -1, -1 < iVar1) {
          std::__cxx11::string::operator[]((ulong)local_40);
          set(in_RDI,iVar2,in_stack_ffffffffffffff8b);
        }
        iVar1 = in_RDI->N;
        while (iVar1 = iVar1 + -1, iVar3 <= iVar1) {
          set(in_RDI,iVar2,in_stack_ffffffffffffff8b);
        }
        std::__cxx11::string::~string(local_40);
        return;
      }
      __assert_fail("num_digits <= N",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/dynamic_bit_vector.h"
                    ,0x9c,
                    "bsim::dynamic_bit_vector::dynamic_bit_vector(const int, const std::string &)");
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](local_18);
    iVar2 = isdigit((int)*pcVar4);
    if (iVar2 == 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[](local_18);
      if (*pcVar4 != '_') {
        __assert_fail("str_raw[i] == \'_\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/dynamic_bit_vector.h"
                      ,0x99,
                      "bsim::dynamic_bit_vector::dynamic_bit_vector(const int, const std::string &)"
                     );
      }
    }
    else {
      local_1c = local_1c + 1;
      pcVar4 = (char *)std::__cxx11::string::operator[](local_18);
      std::__cxx11::string::operator+=(local_40,*pcVar4);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

dynamic_bit_vector(const int N_, const std::string& str_raw) : N(N_) {
      int num_digits = 0;
      std::string str;
      for (int i = 0; i < ((int) str_raw.size()); i++) {
	if (isdigit(str_raw[i])) {
	  num_digits++;
	  str += str_raw[i];
	} else {
	  assert(str_raw[i] == '_');
	}
      }
      assert(num_digits <= N);

      int len = str.size();      
      bits.resize(NUM_BYTES(N));
      for (int i = len - 1; i >= 0; i--) {
        unsigned char val = (str[i] == '0') ? 0 : 1;
        int ind = len - i - 1;
        set(ind, val);
      }
      for (int i = N-1; i>=len; i--) {
        set(i,0);
      }
    }